

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O2

uint __thiscall
flatbuffers::FlatBufferBuilderImpl<true>::PushElement<float,unsigned_int>
          (FlatBufferBuilderImpl<true> *this,float element)

{
  float local_c;
  
  Align(this,4);
  local_c = element;
  vector_downward<unsigned_long>::push_small<float>(&this->buf_,&local_c);
  return (int)(this->buf_).size_ - (int)this->length_of_64_bit_region_;
}

Assistant:

ReturnT PushElement(T element) {
    AssertScalarT<T>();
    Align(sizeof(T));
    buf_.push_small(EndianScalar(element));
    return CalculateOffset<ReturnT>();
  }